

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O2

void cuddLevelQueueDequeue(DdLevelQueue *queue,int level)

{
  DdQueueItem *pDVar1;
  DdQueueItem *pDVar2;
  DdQueueItem *pDVar3;
  DdQueueItem **ppDVar4;
  uint uVar5;
  
  pDVar1 = (DdQueueItem *)queue->first;
  uVar5 = (uint)(*(int *)&pDVar1->key * 0xc00005) >> ((byte)queue->shift & 0x1f);
  pDVar3 = queue->buckets[(int)uVar5];
  if (pDVar3 != (DdQueueItem *)0x0) {
    if (pDVar3 == pDVar1) {
      ppDVar4 = queue->buckets + (int)uVar5;
    }
    else {
      do {
        pDVar2 = pDVar3;
        pDVar3 = pDVar2->cnext;
        if (pDVar3 == (DdQueueItem *)0x0) goto LAB_0061de21;
      } while (pDVar3 != pDVar1);
      ppDVar4 = &pDVar2->cnext;
      pDVar3 = pDVar1;
    }
    *ppDVar4 = pDVar3->cnext;
  }
LAB_0061de21:
  if (queue->last[level] == pDVar1) {
    queue->last[level] = (DdQueueItem *)0x0;
  }
  queue->first = pDVar1->next;
  pDVar1->next = queue->freelist;
  queue->freelist = pDVar1;
  queue->size = queue->size + -1;
  return;
}

Assistant:

void
cuddLevelQueueDequeue(
  DdLevelQueue * queue,
  int  level)
{
    DdQueueItem *item = (DdQueueItem *) queue->first;

    /* Delete from the hash table. */
    hashDelete(queue,item);

    /* Since we delete from the front, if this is the last item for
    ** its level, there are no other items for the same level. */
    if (queue->last[level] == item)
        queue->last[level] = NULL;

    queue->first = item->next;
    /* Put item on the free list. */
    item->next = queue->freelist;
    queue->freelist = item;
    /* Update stats. */
    queue->size--;
    return;

}